

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O3

image * __thiscall
basisu::image::extract_block_clamped
          (image *this,color_rgba *pDst,uint32_t src_x,uint32_t src_y,uint32_t w,uint32_t h)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  color_rgba *__src;
  
  if ((this->m_width < w + src_x) || (this->m_height < h + src_y)) {
    if (h != 0) {
      uVar2 = 0;
      do {
        if (w != 0) {
          uVar3 = uVar2 + src_y;
          uVar4 = src_x;
          uVar5 = w;
          do {
            uVar6 = this->m_width - 1;
            if ((int)uVar4 < (int)uVar6) {
              uVar6 = uVar4;
            }
            if ((int)uVar4 < 0) {
              uVar6 = 0;
            }
            uVar1 = this->m_height - 1;
            if ((int)uVar3 < (int)uVar1) {
              uVar1 = uVar3;
            }
            if ((int)uVar3 < 0) {
              uVar1 = 0;
            }
            if ((this->m_width <= uVar6) || (this->m_height <= uVar1)) {
              __assert_fail("x < m_width && y < m_height",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                            ,0xb00,
                            "const color_rgba &basisu::image::operator()(uint32_t, uint32_t) const")
              ;
            }
            uVar1 = uVar1 * this->m_pitch + uVar6;
            if ((this->m_pixels).m_size <= uVar1) goto LAB_0021c395;
            *pDst = (color_rgba)(this->m_pixels).m_p[uVar1].field_0;
            pDst = (color_rgba *)(&pDst->field_0 + 1);
            uVar4 = uVar4 + 1;
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 != h);
    }
  }
  else {
    uVar3 = src_y * this->m_pitch + src_x;
    if ((this->m_pixels).m_size <= uVar3) {
LAB_0021c395:
      __assert_fail("i < m_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                    ,0x177,
                    "const T &basisu::vector<basisu::color_rgba>::operator[](size_t) const [T = basisu::color_rgba]"
                   );
    }
    if (h != 0) {
      __src = (this->m_pixels).m_p + uVar3;
      do {
        memcpy(pDst,__src,(ulong)w * 4);
        __src = __src + this->m_pitch;
        pDst = pDst + w;
        h = h - 1;
      } while (h != 0);
    }
  }
  return this;
}

Assistant:

const image &extract_block_clamped(color_rgba *pDst, uint32_t src_x, uint32_t src_y, uint32_t w, uint32_t h) const
		{
			if (((src_x + w) > m_width) || ((src_y + h) > m_height))
			{
				// Slower clamping case
				for (uint32_t y = 0; y < h; y++)
					for (uint32_t x = 0; x < w; x++)
						*pDst++ = get_clamped(src_x + x, src_y + y);
			}
			else
			{
				const color_rgba* pSrc = &m_pixels[src_x + src_y * m_pitch];

				for (uint32_t y = 0; y < h; y++)
				{
					memcpy(pDst, pSrc, w * sizeof(color_rgba));
					pSrc += m_pitch;
					pDst += w;
				}
			}

			return *this;
		}